

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerMSL::to_swizzle_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,uint32_t id)

{
  Variant *pVVar1;
  long lVar2;
  SPIRCombinedImageSampler *pSVar3;
  ulong uVar4;
  ulong uVar5;
  long *plVar6;
  size_type *psVar7;
  char cVar8;
  string expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> array_expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> image_expr;
  string local_a0;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  uVar4 = (ulong)id;
  if ((uVar4 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr,
     pVVar1[uVar4].type == TypeCombinedImageSampler)) {
    pSVar3 = Variant::get<spirv_cross::SPIRCombinedImageSampler>(pVVar1 + uVar4);
    id = (pSVar3->image).id;
  }
  CompilerGLSL::to_expression_abi_cxx11_(&local_a0,&this->super_CompilerGLSL,id,true);
  cVar8 = (char)&local_a0;
  uVar4 = ::std::__cxx11::string::find(cVar8,0x5b);
  uVar5 = ::std::__cxx11::string::find(cVar8,0x2e);
  if (uVar5 < uVar4) {
    do {
      local_a0._M_dataplus._M_p[uVar5] = '_';
      uVar5 = ::std::__cxx11::string::find((char)&local_a0,0x2e);
    } while (uVar5 < uVar4);
  }
  if (uVar4 == 0xffffffffffffffff) {
    ::std::operator+(__return_storage_ptr__,&local_a0,&this->swizzle_name_suffix);
  }
  else {
    ::std::__cxx11::string::substr((ulong)&local_40,(ulong)&local_a0);
    ::std::__cxx11::string::substr((ulong)local_80,(ulong)&local_a0);
    ::std::operator+(&local_60,&local_40,&this->swizzle_name_suffix);
    plVar6 = (long *)::std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_80[0]);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar7) {
      lVar2 = plVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    }
    __return_storage_ptr__->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if (local_80[0] != local_70) {
      operator_delete(local_80[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_swizzle_expression(uint32_t id)
{
	auto *combined = maybe_get<SPIRCombinedImageSampler>(id);

	auto expr = to_expression(combined ? combined->image : VariableID(id));
	auto index = expr.find_first_of('[');

	// If an image is part of an argument buffer translate this to a legal identifier.
	string::size_type period = 0;
	while ((period = expr.find_first_of('.', period)) != string::npos && period < index)
		expr[period] = '_';

	if (index == string::npos)
		return expr + swizzle_name_suffix;
	else
	{
		auto image_expr = expr.substr(0, index);
		auto array_expr = expr.substr(index);
		return image_expr + swizzle_name_suffix + array_expr;
	}
}